

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>::emplaceValue<QPointer<QHttp2Stream>>
          (Node<QObject*,QPointer<QHttp2Stream>> *this,QPointer<QHttp2Stream> *args)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  uVar2 = *(undefined4 *)&(args->wp).d;
  uVar3 = *(undefined4 *)((long)&(args->wp).d + 4);
  uVar4 = *(undefined4 *)&(args->wp).value;
  uVar5 = *(undefined4 *)((long)&(args->wp).value + 4);
  (args->wp).d = (Data *)0x0;
  (args->wp).value = (QObject *)0x0;
  piVar1 = *(int **)(this + 8);
  *(undefined4 *)(this + 8) = uVar2;
  *(undefined4 *)(this + 0xc) = uVar3;
  *(undefined4 *)(this + 0x10) = uVar4;
  *(undefined4 *)(this + 0x14) = uVar5;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      operator_delete(piVar1);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }